

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

void __thiscall
QParallelAnimationGroup::updateState(QParallelAnimationGroup *this,State newState,State oldState)

{
  bool bVar1;
  State SVar2;
  QParallelAnimationGroupPrivate *this_00;
  const_iterator cVar3;
  const_iterator o;
  QAbstractAnimation **ppQVar4;
  State in_EDX;
  State in_ESI;
  QAbstractAnimation *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  QParallelAnimationGroupPrivate *d;
  AnimationListConstIt cend_2;
  AnimationListConstIt it_2;
  AnimationListConstIt cend_1;
  AnimationListConstIt it_1;
  AnimationListConstIt cend;
  AnimationListConstIt it;
  QParallelAnimationGroupPrivate *in_stack_ffffffffffffff78;
  QAbstractAnimation *pQVar5;
  DeletionPolicy policy;
  QAbstractAnimation *animation_00;
  const_iterator local_28;
  QAbstractAnimation **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QParallelAnimationGroup *)0x67d1b8);
  QAbstractAnimation::updateState(in_RDI,in_ESI,in_EDX);
  if (in_ESI == Stopped) {
    local_10.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QAbstractAnimation_*>::constBegin((QList<QAbstractAnimation_*> *)in_RDI);
    local_18.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QAbstractAnimation_*>::constEnd((QList<QAbstractAnimation_*> *)in_RDI);
    while( true ) {
      local_20 = local_18.i;
      bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_10,local_18);
      if (!bVar1) break;
      QList<QAbstractAnimation_*>::const_iterator::operator*(&local_10);
      QAbstractAnimation::stop((QAbstractAnimation *)in_RDI);
      QList<QAbstractAnimation_*>::const_iterator::operator++(&local_10);
    }
    QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations(in_stack_ffffffffffffff78);
  }
  else if (in_ESI == Paused) {
    local_28.i = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QAbstractAnimation_*>::constBegin((QList<QAbstractAnimation_*> *)in_RDI);
    cVar3 = QList<QAbstractAnimation_*>::constEnd((QList<QAbstractAnimation_*> *)in_RDI);
    while (bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=(&local_28,cVar3), bVar1)
    {
      QList<QAbstractAnimation_*>::const_iterator::operator*(&local_28);
      SVar2 = QAbstractAnimation::state((QAbstractAnimation *)in_RDI);
      if (SVar2 == Running) {
        ppQVar4 = QList<QAbstractAnimation_*>::const_iterator::operator*(&local_28);
        QAbstractAnimation::pause((QAbstractAnimation *)*ppQVar4);
      }
      QList<QAbstractAnimation_*>::const_iterator::operator++(&local_28);
    }
  }
  else if (in_ESI == Running) {
    QParallelAnimationGroupPrivate::connectUncontrolledAnimations(in_stack_ffffffffffffff78);
    cVar3 = QList<QAbstractAnimation_*>::constBegin((QList<QAbstractAnimation_*> *)in_RDI);
    o = QList<QAbstractAnimation_*>::constEnd((QList<QAbstractAnimation_*> *)in_RDI);
    while (bVar1 = QList<QAbstractAnimation_*>::const_iterator::operator!=
                             ((const_iterator *)&stack0xffffffffffffffc0,o), bVar1) {
      ppQVar4 = QList<QAbstractAnimation_*>::const_iterator::operator*
                          ((const_iterator *)&stack0xffffffffffffffc0);
      pQVar5 = *ppQVar4;
      if (in_EDX == Stopped) {
        QAbstractAnimation::stop((QAbstractAnimation *)in_RDI);
      }
      animation_00 = pQVar5;
      ::QObjectCompatProperty::operator_cast_to_Direction
                ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                  *)0x67d3d7);
      policy = (DeletionPolicy)((ulong)pQVar5 >> 0x20);
      QAbstractAnimation::setDirection
                ((QAbstractAnimation *)cVar3.i,(Direction)((ulong)o.i >> 0x20));
      bVar1 = QParallelAnimationGroupPrivate::shouldAnimationStart
                        (this_00,animation_00,SUB41(in_ESI >> 0x18,0));
      if (bVar1) {
        QAbstractAnimation::start((QAbstractAnimation *)in_RDI,policy);
      }
      QList<QAbstractAnimation_*>::const_iterator::operator++
                ((const_iterator *)&stack0xffffffffffffffc0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateState(QAbstractAnimation::State newState,
                                          QAbstractAnimation::State oldState)
{
    Q_D(QParallelAnimationGroup);
    QAnimationGroup::updateState(newState, oldState);

    switch (newState) {
    case Stopped:
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it)
            (*it)->stop();
        d->disconnectUncontrolledAnimations();
        break;
    case Paused:
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            if ((*it)->state() == Running)
                (*it)->pause();
        }
        break;
    case Running:
        d->connectUncontrolledAnimations();
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            QAbstractAnimation *animation = *it;
            if (oldState == Stopped)
                animation->stop();
            animation->setDirection(d->direction);
            if (d->shouldAnimationStart(animation, oldState == Stopped))
                animation->start();
        }
        break;
    }
}